

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

void mpz_set(__mpz_struct *r,__mpz_struct *x)

{
  uint uVar1;
  mp_limb_t *pmVar2;
  uint uVar3;
  mp_ptr pmVar4;
  ulong uVar5;
  
  if (r != x) {
    uVar1 = x->_mp_size;
    uVar3 = -uVar1;
    if (0 < (int)uVar1) {
      uVar3 = uVar1;
    }
    if (r->_mp_alloc < (int)uVar3) {
      pmVar4 = mpz_realloc(r,(ulong)uVar3);
    }
    else {
      pmVar4 = r->_mp_d;
    }
    if (uVar1 != 0) {
      pmVar2 = x->_mp_d;
      uVar5 = 0;
      do {
        pmVar4[uVar5] = pmVar2[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
    }
    r->_mp_size = x->_mp_size;
  }
  return;
}

Assistant:

void
mpz_set (mpz_t r, const mpz_t x)
{
  /* Allow the NOP r == x */
  if (r != x)
    {
      mp_size_t n;
      mp_ptr rp;

      n = GMP_ABS (x->_mp_size);
      rp = MPZ_REALLOC (r, n);

      mpn_copyi (rp, x->_mp_d, n);
      r->_mp_size = x->_mp_size;
    }
}